

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cDrawIndirectTests.cpp
# Opt level: O2

long __thiscall
glcts::anon_unknown_0::CBufferGetPointerv<glcts::(anonymous_namespace)::test_api::GL>::Run
          (CBufferGetPointerv<glcts::(anonymous_namespace)::test_api::GL> *this)

{
  CallLogWrapper *this_00;
  GLboolean GVar1;
  void *pvVar2;
  long _code;
  void *pvVar3;
  DIResult *pDVar4;
  uint in_R9D;
  uint in_stack_fffffffffffffb20;
  void *ptr;
  int dataHeight;
  int dataWidth;
  CDataArray dataRef;
  DILogger local_4a8;
  DIResult result;
  DILogger local_1a0;
  
  DIResult::DIResult(&result);
  this_00 = &(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper;
  glu::CallLogWrapper::glGenBuffers(this_00,1,&this->_buffer);
  glu::CallLogWrapper::glBindBuffer(this_00,0x8f3f,this->_buffer);
  dataRef.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  dataRef.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  dataRef.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  DrawIndirectBase::getDataSize(&this->super_DrawIndirectBase,&dataWidth,&dataHeight);
  DrawIndirectBase::DataGen<unsigned_int>
            ((DrawIndirectBase *)&dataRef,
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)(ulong)(uint)dataWidth,
             dataHeight,0x1e,0x32,in_R9D);
  glu::CallLogWrapper::glBufferData
            (this_00,0x8f3f,
             (long)dataRef.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)dataRef.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_start,
             dataRef.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start,0x88e8);
  ptr = (void *)0x0;
  glu::CallLogWrapper::glGetBufferPointerv(this_00,0x8f3f,0x88bd,&ptr);
  if (ptr != (void *)0x0) {
    pDVar4 = &result;
    DIResult::error(&local_4a8,pDVar4);
    glcts::(anonymous_namespace)::DILogger::operator<<
              ((DILogger *)&local_4a8,(char (*) [109])pDVar4);
    DILogger::~DILogger(&local_4a8);
  }
  pvVar2 = glu::CallLogWrapper::glMapBufferRange
                     (this_00,0x8f3f,0,
                      (long)dataRef.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                      (long)dataRef.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                            _M_impl.super__Vector_impl_data._M_start,1);
  if (pvVar2 == (void *)0x0) {
    DIResult::error(&local_4a8,&result);
    glcts::(anonymous_namespace)::DILogger::operator<<
              ((DILogger *)&local_4a8,
               (char (*) [73])
               "glMapBufferRange(GL_DRAW_INDIRECT_BUFFER, GL_MAP_READ_BIT) returned NULL");
  }
  else {
    glu::CallLogWrapper::glGetBufferPointerv(this_00,0x8f3f,0x88bd,&ptr);
    if (ptr == (void *)0x0) {
      pDVar4 = &result;
      DIResult::error(&local_4a8,pDVar4);
      glcts::(anonymous_namespace)::DILogger::operator<<
                ((DILogger *)&local_4a8,(char (*) [82])pDVar4);
      DILogger::~DILogger(&local_4a8);
      if (ptr != (void *)0x0) goto LAB_00baa619;
      pvVar3 = (void *)0x0;
    }
    else {
LAB_00baa619:
      _code = DrawIndirectBase::BufferCheck
                        ((DrawIndirectBase *)&dataRef,(CDataArray *)(ulong)(uint)dataWidth,
                         dataHeight,(uint)ptr,(void *)(ulong)(uint)dataWidth,dataHeight,0,
                         in_stack_fffffffffffffb20,(uint)ptr);
      DIResult::sub_result(&local_1a0,&result,_code);
      DILogger::~DILogger(&local_1a0);
      pvVar3 = ptr;
    }
    if (pvVar3 != pvVar2) {
      pDVar4 = &result;
      DIResult::error(&local_4a8,pDVar4);
      glcts::(anonymous_namespace)::DILogger::operator<<
                ((DILogger *)&local_4a8,(char (*) [128])pDVar4);
      DILogger::~DILogger(&local_4a8);
    }
    GVar1 = glu::CallLogWrapper::glUnmapBuffer(this_00,0x8f3f);
    if (GVar1 != '\0') goto LAB_00baa6e3;
    pDVar4 = &result;
    DIResult::error(&local_4a8,pDVar4);
    glcts::(anonymous_namespace)::DILogger::operator<<((DILogger *)&local_4a8,(char (*) [75])pDVar4)
    ;
  }
  DILogger::~DILogger(&local_4a8);
LAB_00baa6e3:
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&dataRef.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  DILogger::~DILogger(&result.logger_);
  return result.status_;
}

Assistant:

virtual long Run()
	{
		DIResult result;

		glGenBuffers(1, &_buffer);
		glBindBuffer(GL_DRAW_INDIRECT_BUFFER, _buffer);

		CDataArray dataRef;
		int		   dataWidth, dataHeight;
		getDataSize(dataWidth, dataHeight);
		DataGen<unsigned int>(dataRef, dataWidth, dataHeight, 30, 50);
		glBufferData(GL_DRAW_INDIRECT_BUFFER, (GLsizeiptr)(dataRef.size() * sizeof(unsigned int)), &dataRef[0],
					 GL_DYNAMIC_DRAW);

		void* ptr = 0;
		glGetBufferPointerv(GL_DRAW_INDIRECT_BUFFER, GL_BUFFER_MAP_POINTER, &ptr);

		if (ptr != 0)
		{
			result.error() << "glGetBufferPointerv(GL_DRAW_INDIRECT_BUFFER, GL_BUFFER_MAP_POINTER) returned invalid "
							  "pointer, expected: NULL";
		}

		void* buf = glMapBufferRange(GL_DRAW_INDIRECT_BUFFER, 0, (GLsizeiptr)(dataRef.size() * sizeof(unsigned int)),
									 GL_MAP_READ_BIT);
		if (buf == 0)
		{
			result.error() << "glMapBufferRange(GL_DRAW_INDIRECT_BUFFER, GL_MAP_READ_BIT) returned NULL";

			return result.code();
		}

		glGetBufferPointerv(GL_DRAW_INDIRECT_BUFFER, GL_BUFFER_MAP_POINTER, &ptr);

		if (ptr == 0)
		{
			result.error() << "glGetBufferPointerv(GL_DRAW_INDIRECT_BUFFER, GL_BUFFER_MAP_POINTER) returned NULL";
		}

		if (ptr)
		{
			result.sub_result(BufferCheck(dataRef, dataWidth, dataHeight, ptr, dataWidth, dataHeight));
		}

		if (ptr != buf)
		{
			result.error() << "glGetBufferPointerv(GL_DRAW_INDIRECT_BUFFER, GL_BUFFER_MAP_POINTER) different pointer "
							  "than glMapBuffer(GL_DRAW_INDIRECT_BUFFER)";
		}

		if (glUnmapBuffer(GL_DRAW_INDIRECT_BUFFER) == GL_FALSE)
		{
			result.error() << "glUnmapBuffer(GL_DRAW_INDIRECT_BUFFER) returned GL_FALSE, expected GL_TRUE";
		}
		buf = 0;
		ptr = 0;

		return result.code();
	}